

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgHierarchyManipulator.cpp
# Opt level: O0

void TasGrid::HierarchyManipulations::completeToLower<(TasGrid::RuleLocal::erule)1>
               (MultiIndexSet *mset,MultiIndexSet *refined)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_t new_stride;
  int *__first;
  int *piVar4;
  MultiIndexSet local_d8;
  int local_ac;
  reference piStack_a8;
  int r;
  int *p;
  iterator __end4;
  iterator __begin4;
  vector<int,_std::allocator<int>_> *__range4;
  undefined1 local_80 [8];
  vector<int,_std::allocator<int>_> parent;
  int i;
  undefined1 local_50 [4];
  int num_points;
  Data2D<int> addons;
  size_t num_added;
  size_t num_dimensions;
  MultiIndexSet *refined_local;
  MultiIndexSet *mset_local;
  
  new_stride = MultiIndexSet::getNumDimensions(mset);
  addons.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x1;
  while (addons.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage != (pointer)0x0) {
    Data2D<int>::Data2D<unsigned_long,int>((Data2D<int> *)local_50,new_stride,0);
    iVar2 = MultiIndexSet::getNumIndexes(refined);
    for (parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._0_4_ = 0;
        (int)parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage < iVar2;
        parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ =
             (int)parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + 1) {
      __first = MultiIndexSet::getIndex
                          (refined,(int)parent.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                        .super__Vector_impl_data._M_end_of_storage);
      piVar4 = MultiIndexSet::getIndex
                         (refined,(int)parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage);
      ::std::allocator<int>::allocator((allocator<int> *)((long)&__range4 + 7));
      ::std::vector<int,std::allocator<int>>::vector<int_const*,void>
                ((vector<int,std::allocator<int>> *)local_80,__first,piVar4 + new_stride,
                 (allocator<int> *)((long)&__range4 + 7));
      ::std::allocator<int>::~allocator((allocator<int> *)((long)&__range4 + 7));
      __end4 = ::std::vector<int,_std::allocator<int>_>::begin
                         ((vector<int,_std::allocator<int>_> *)local_80);
      p = (int *)::std::vector<int,_std::allocator<int>_>::end
                           ((vector<int,_std::allocator<int>_> *)local_80);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                         *)&p), bVar1) {
        piStack_a8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&__end4);
        local_ac = *piStack_a8;
        iVar3 = RuleLocal::getParent<(TasGrid::RuleLocal::erule)1>(local_ac);
        *piStack_a8 = iVar3;
        if (((*piStack_a8 != -1) &&
            (bVar1 = MultiIndexSet::missing(refined,(vector<int,_std::allocator<int>_> *)local_80),
            bVar1)) &&
           (bVar1 = MultiIndexSet::missing(mset,(vector<int,_std::allocator<int>_> *)local_80),
           bVar1)) {
          Data2D<int>::appendStrip
                    ((Data2D<int> *)local_50,(vector<int,_std::allocator<int>_> *)local_80);
        }
        iVar3 = RuleLocal::getStepParent<(TasGrid::RuleLocal::erule)1>(local_ac);
        *piStack_a8 = iVar3;
        if (((*piStack_a8 != -1) &&
            (bVar1 = MultiIndexSet::missing(refined,(vector<int,_std::allocator<int>_> *)local_80),
            bVar1)) &&
           (bVar1 = MultiIndexSet::missing(mset,(vector<int,_std::allocator<int>_> *)local_80),
           bVar1)) {
          Data2D<int>::appendStrip
                    ((Data2D<int> *)local_50,(vector<int,_std::allocator<int>_> *)local_80);
        }
        *piStack_a8 = local_ac;
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end4);
      }
      ::std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_80);
    }
    iVar2 = Data2D<int>::getNumStrips((Data2D<int> *)local_50);
    addons.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)(long)iVar2;
    if (addons.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage != (pointer)0x0) {
      MultiIndexSet::MultiIndexSet(&local_d8,(Data2D<int> *)local_50);
      MultiIndexSet::operator+=(refined,&local_d8);
      MultiIndexSet::~MultiIndexSet(&local_d8);
    }
    Data2D<int>::~Data2D((Data2D<int> *)local_50);
  }
  return;
}

Assistant:

void completeToLower(MultiIndexSet const &mset, MultiIndexSet &refined){
    size_t num_dimensions = mset.getNumDimensions();
    size_t num_added = 1; // set to 1 to start the loop
    while(num_added > 0){
        Data2D<int> addons(num_dimensions, 0);
        int num_points = refined.getNumIndexes();

        for(int i=0; i<num_points; i++){
            std::vector<int> parent(refined.getIndex(i), refined.getIndex(i) + num_dimensions);
            for(auto &p : parent){
                int r = p;
                p = RuleLocal::getParent<effrule>(r);
                if ((p != -1) && refined.missing(parent) && mset.missing(parent))
                    addons.appendStrip(parent);
                p = RuleLocal::getStepParent<effrule>(r);
                if ((p != -1) && refined.missing(parent) && mset.missing(parent))
                    addons.appendStrip(parent);
                p = r;
            }
        }

        num_added = addons.getNumStrips();
        if (num_added > 0) refined += addons;
    }
}